

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O0

char * crn_get_mip_mode_name(crn_mip_mode m)

{
  crn_mip_mode m_local;
  char *local_8;
  
  switch(m) {
  case cCRNMipModeUseSourceOrGenerateMips:
    local_8 = "UseSourceOrGenerate";
    break;
  case cCRNMipModeUseSourceMips:
    local_8 = "UseSource";
    break;
  case cCRNMipModeGenerateMips:
    local_8 = "Generate";
    break;
  case cCRNMipModeNoMips:
    local_8 = "None";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* crn_get_mip_mode_name(crn_mip_mode m) {
  switch (m) {
    case cCRNMipModeUseSourceOrGenerateMips:
      return "UseSourceOrGenerate";
    case cCRNMipModeUseSourceMips:
      return "UseSource";
    case cCRNMipModeGenerateMips:
      return "Generate";
    case cCRNMipModeNoMips:
      return "None";
    default:
      break;
  }
  return "?";
}